

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_CwdRelativeInputNotFoundAndNotMappedError_Test::TestBody
          (CommandLineInterfaceTest_CwdRelativeInputNotFoundAndNotMappedError_Test *this)

{
  string_view name;
  string_view expected_text;
  string local_38;
  
  name._M_str = "bar/dummy";
  name._M_len = 9;
  CommandLineInterfaceTester::CreateTempFile
            ((CommandLineInterfaceTester *)this,name,(string_view)(ZEXT816(0x10f75f1) << 0x40));
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "protocol_compiler --test_out=$tmpdir --proto_path=$tmpdir/bar $tmpdir/foo.proto","");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  expected_text._M_str =
       "Could not make proto path relative: $tmpdir/foo.proto: No such file or directory\n";
  expected_text._M_len = 0x51;
  CommandLineInterfaceTester::ExpectErrorText((CommandLineInterfaceTester *)this,expected_text);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, CwdRelativeInputNotFoundAndNotMappedError) {
  // Check what happens if the input file is not found *and* is not mapped
  // in the proto_path.

  // Create a directory called "bar" so that we can point --proto_path at it.
  CreateTempFile("bar/dummy", "");

  Run("protocol_compiler --test_out=$tmpdir "
      "--proto_path=$tmpdir/bar $tmpdir/foo.proto");

  ExpectErrorText(
      "Could not make proto path relative: $tmpdir/foo.proto: No such file or "
      "directory\n");
}